

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O1

int CBB_add_utf8(CBB *cbb,uint32_t u)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (0x10ffff < u) {
    return 0;
  }
  if ((u & 0x1ff800) == 0xd800) {
    return 0;
  }
  if ((u & 0xfffe) == 0xfffe) {
    return 0;
  }
  if (0x1f < u - 0xfdd0) {
    if (u < 0x80) {
      iVar2 = CBB_add_u8(cbb,(byte)u);
      return iVar2;
    }
    if (u < 0x800) {
      bVar1 = (byte)(u >> 6) | 0xc0;
    }
    else {
      if (u < 0x10000) {
        bVar1 = (byte)(u >> 0xc) | 0xe0;
      }
      else {
        if (0x10ffff < u) {
          return 0;
        }
        iVar2 = CBB_add_u8(cbb,(byte)(u >> 0x12) | 0xf0);
        if (iVar2 == 0) {
          return 0;
        }
        bVar1 = (byte)(u >> 0xc) & 0x3f | 0x80;
      }
      iVar2 = CBB_add_u8(cbb,bVar1);
      if (iVar2 == 0) {
        return 0;
      }
      bVar1 = (byte)(u >> 6) & 0x3f | 0x80;
    }
    iVar2 = CBB_add_u8(cbb,bVar1);
    if (iVar2 != 0) {
      iVar2 = CBB_add_u8(cbb,(byte)u & 0x3f | 0x80);
      uVar3 = (uint)(iVar2 != 0);
    }
    return uVar3;
  }
  return 0;
}

Assistant:

int CBB_add_utf8(CBB *cbb, uint32_t u) {
  if (!is_valid_code_point(u)) {
    return 0;
  }
  if (u <= 0x7f) {
    return CBB_add_u8(cbb, (uint8_t)u);
  }
  if (u <= 0x7ff) {
    return CBB_add_u8(cbb, TOP_BITS(2) | (u >> 6)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  if (u <= 0xffff) {
    return CBB_add_u8(cbb, TOP_BITS(3) | (u >> 12)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 6) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  if (u <= 0x10ffff) {
    return CBB_add_u8(cbb, TOP_BITS(4) | (u >> 18)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 12) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 6) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  return 0;
}